

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O2

void __thiscall IntersectionHelper::intersect_by_8(IntersectionHelper *this)

{
  bool bVar1;
  
  while ((this->run_it_ < this->run_end_ + -8 && (this->seq_it_ < this->seq_end_))) {
    bVar1 = step_by_8(this);
    if (!bVar1) {
      step_single(this);
    }
  }
  return;
}

Assistant:

void IntersectionHelper::intersect_by_8() {
    while (run_it_ < run_end_ - 8 && seq_it_ < seq_end_) {
        if (step_by_8()) {
            continue;
        }
        step_single();
    }
}